

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedNumberFormat::getNumberOfRuleSetNames(RuleBasedNumberFormat *this)

{
  int iVar1;
  NFRuleSet **p;
  NFRuleSet **ppNVar2;
  
  if (this->localizations != (LocalizationInfo *)0x0) {
    iVar1 = (*this->localizations->_vptr_LocalizationInfo[3])();
    return iVar1;
  }
  ppNVar2 = this->fRuleSets;
  iVar1 = 0;
  if (ppNVar2 != (NFRuleSet **)0x0) {
    for (; *ppNVar2 != (NFRuleSet *)0x0; ppNVar2 = ppNVar2 + 1) {
      iVar1 = (iVar1 + 1) - (uint)((*ppNVar2)->fIsPublic == '\0');
    }
  }
  return iVar1;
}

Assistant:

int32_t
RuleBasedNumberFormat::getNumberOfRuleSetNames() const
{
    int32_t result = 0;
    if (localizations) {
        result = localizations->getNumberOfRuleSets();
    }
    else if (fRuleSets) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            if ((**p).isPublic()) {
                ++result;
            }
        }
    }
    return result;
}